

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voprf.cc
# Opt level: O0

int dleq_generate(VOPRF_METHOD *method,CBB *cbb,TRUST_TOKEN_ISSUER_KEY *priv,EC_JACOBIAN *T,
                 EC_JACOBIAN *W)

{
  int iVar1;
  EC_GROUP *group_00;
  undefined1 local_710 [8];
  EC_SCALAR u;
  EC_SCALAR c_mont;
  EC_SCALAR c;
  EC_AFFINE affines [4];
  undefined1 local_3f0 [8];
  EC_SCALAR r;
  EC_JACOBIAN jacobians [4];
  EC_GROUP *group;
  EC_JACOBIAN *W_local;
  EC_JACOBIAN *T_local;
  TRUST_TOKEN_ISSUER_KEY *priv_local;
  CBB *cbb_local;
  VOPRF_METHOD *method_local;
  
  group_00 = (*method->group_func)();
  iVar1 = ec_random_nonzero_scalar(group_00,(EC_SCALAR *)local_3f0,"");
  if (((iVar1 == 0) ||
      (iVar1 = ec_point_mul_scalar_base
                         (group_00,(EC_JACOBIAN *)(jacobians[1].Z.words + 8),(EC_SCALAR *)local_3f0)
      , iVar1 == 0)) ||
     (iVar1 = ec_point_mul_scalar(group_00,(EC_JACOBIAN *)(jacobians[2].Z.words + 8),T,
                                  (EC_SCALAR *)local_3f0), iVar1 == 0)) {
    return 0;
  }
  memcpy(r.words + 8,T,0xd8);
  memcpy(jacobians[0].Z.words + 8,W,0xd8);
  iVar1 = ec_jacobian_to_affine_batch
                    (group_00,(EC_AFFINE *)(c.words + 8),(EC_JACOBIAN *)(r.words + 8),4);
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = hash_to_scalar_dleq(method,(EC_SCALAR *)(c_mont.words + 8),&priv->pubs,
                              (EC_AFFINE *)(c.words + 8),(EC_AFFINE *)(affines[0].Y.words + 8),
                              (EC_AFFINE *)(affines[1].Y.words + 8),
                              (EC_AFFINE *)(affines[2].Y.words + 8));
  if (iVar1 == 0) {
    return 0;
  }
  ec_scalar_to_montgomery(group_00,(EC_SCALAR *)(u.words + 8),(EC_SCALAR *)(c_mont.words + 8));
  ec_scalar_mul_montgomery(group_00,(EC_SCALAR *)local_710,&priv->xs,(EC_SCALAR *)(u.words + 8));
  ec_scalar_add(group_00,(EC_SCALAR *)local_710,(EC_SCALAR *)local_3f0,(EC_SCALAR *)local_710);
  iVar1 = scalar_to_cbb(cbb,group_00,(EC_SCALAR *)(c_mont.words + 8));
  if ((iVar1 != 0) && (iVar1 = scalar_to_cbb(cbb,group_00,(EC_SCALAR *)local_710), iVar1 != 0)) {
    return 1;
  }
  return 0;
}

Assistant:

static int dleq_generate(const VOPRF_METHOD *method, CBB *cbb,
                         const TRUST_TOKEN_ISSUER_KEY *priv,
                         const EC_JACOBIAN *T, const EC_JACOBIAN *W) {
  const EC_GROUP *group = method->group_func();

  enum {
    idx_T,
    idx_W,
    idx_k0,
    idx_k1,
    num_idx,
  };
  EC_JACOBIAN jacobians[num_idx];

  // Setup the DLEQ proof.
  EC_SCALAR r;
  if (  // r <- Zp
      !ec_random_nonzero_scalar(group, &r, kDefaultAdditionalData) ||
      // k0;k1 = r*(G;T)
      !ec_point_mul_scalar_base(group, &jacobians[idx_k0], &r) ||
      !ec_point_mul_scalar(group, &jacobians[idx_k1], T, &r)) {
    return 0;
  }

  EC_AFFINE affines[num_idx];
  jacobians[idx_T] = *T;
  jacobians[idx_W] = *W;
  if (!ec_jacobian_to_affine_batch(group, affines, jacobians, num_idx)) {
    return 0;
  }

  // Compute c = Hc(...).
  EC_SCALAR c;
  if (!hash_to_scalar_dleq(method, &c, &priv->pubs, &affines[idx_T],
                           &affines[idx_W], &affines[idx_k0],
                           &affines[idx_k1])) {
    return 0;
  }


  EC_SCALAR c_mont;
  ec_scalar_to_montgomery(group, &c_mont, &c);

  // u = r + c*xs
  EC_SCALAR u;
  ec_scalar_mul_montgomery(group, &u, &priv->xs, &c_mont);
  ec_scalar_add(group, &u, &r, &u);

  // Store DLEQ proof in transcript.
  if (!scalar_to_cbb(cbb, group, &c) || !scalar_to_cbb(cbb, group, &u)) {
    return 0;
  }

  return 1;
}